

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

void __thiscall section_data::polygon_to_gds(section_data *this,string *outpath)

{
  uint layer;
  bool bVar1;
  pointer ppVar2;
  pointer corX;
  pointer pcVar3;
  vector<int,_std::allocator<int>_> *in_RCX;
  void *__buf;
  gdsSTR local_3a0;
  _Base_ptr local_2a8;
  co_ord *local_2a0;
  gdsBOUNDARY local_298;
  __normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_> local_230;
  __normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_> local_228;
  iterator layer_polygon_it;
  _Self local_218;
  iterator polymap_it;
  vector<int,_std::allocator<int>_> y_cor;
  vector<int,_std::allocator<int>_> x_cor;
  undefined1 local_1d0 [8];
  gdsSTR main;
  gdscpp my_polygons;
  string *outpath_local;
  section_data *this_local;
  
  gdscpp::gdscpp((gdscpp *)
                 &main.BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  gdsSTR::gdsSTR((gdsSTR *)local_1d0);
  std::__cxx11::string::operator=((string *)local_1d0,"Polygons");
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &y_cor.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&polymap_it);
  local_218._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
       ::begin(&this->polygons);
  while( true ) {
    layer_polygon_it._M_current =
         (co_ord *)
         std::
         map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
         ::end(&this->polygons);
    bVar1 = std::operator!=(&local_218,(_Self *)&layer_polygon_it);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
             ::operator->(&local_218);
    local_228._M_current =
         (co_ord *)std::vector<co_ord,_std::allocator<co_ord>_>::begin(&ppVar2->second);
    while( true ) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
               ::operator->(&local_218);
      local_230._M_current =
           (co_ord *)std::vector<co_ord,_std::allocator<co_ord>_>::end(&ppVar2->second);
      bVar1 = __gnu_cxx::operator<(&local_228,&local_230);
      if (!bVar1) break;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
               ::operator->(&local_218);
      layer = ppVar2->first;
      corX = __gnu_cxx::__normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_>::
             operator->(&local_228);
      pcVar3 = __gnu_cxx::__normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_>
               ::operator->(&local_228);
      in_RCX = &pcVar3->y;
      drawBoundary(&local_298,layer,&corX->x,in_RCX);
      std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::push_back
                ((vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_> *)
                 &main.last_modified.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_298);
      gdsBOUNDARY::~gdsBOUNDARY(&local_298);
      local_2a0 = (co_ord *)
                  __gnu_cxx::
                  __normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_>::
                  operator++(&local_228,0);
    }
    local_2a8 = (_Base_ptr)
                std::
                _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
                ::operator++(&local_218,0);
  }
  gdsSTR::gdsSTR(&local_3a0,(gdsSTR *)local_1d0);
  gdscpp::setSTR((gdscpp *)
                 &main.BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_3a0);
  gdsSTR::~gdsSTR(&local_3a0);
  gdscpp::write((gdscpp *)
                &main.BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(int)outpath,__buf,(size_t)in_RCX);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&polymap_it);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &y_cor.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  gdsSTR::~gdsSTR((gdsSTR *)local_1d0);
  gdscpp::~gdscpp((gdscpp *)
                  &main.BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void section_data::polygon_to_gds(const string &outpath)
{
  gdscpp my_polygons;
  gdsSTR main;
  main.name = "Polygons";
  vector<int> x_cor, y_cor;
  // std::map<unsigned int, std::vector<co_ord>> polygons; // key = layer number
  for (auto polymap_it = polygons.begin(); polymap_it != polygons.end();
       polymap_it++) {
    for (auto layer_polygon_it = polymap_it->second.begin();
         layer_polygon_it < polymap_it->second.end(); layer_polygon_it++) {
      main.BOUNDARY.push_back(drawBoundary(
          polymap_it->first, layer_polygon_it->x, layer_polygon_it->y));
    }
  }
  my_polygons.setSTR(main);
  my_polygons.write(outpath);
}